

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xatlas.cpp
# Opt level: O0

uint32_t __thiscall
xatlas::internal::
HashMap<unsigned_int,_xatlas::internal::Hash<unsigned_int>,_xatlas::internal::Equal<unsigned_int>_>
::getNext(HashMap<unsigned_int,_xatlas::internal::Hash<unsigned_int>,_xatlas::internal::Equal<unsigned_int>_>
          *this,uint32_t current)

{
  bool bVar1;
  uint *puVar2;
  uint *k1;
  Equal<unsigned_int> local_21;
  uint32_t local_20;
  uint32_t uStack_1c;
  Equal<unsigned_int> equal;
  uint32_t i;
  uint32_t current_local;
  HashMap<unsigned_int,_xatlas::internal::Hash<unsigned_int>,_xatlas::internal::Equal<unsigned_int>_>
  *this_local;
  
  uStack_1c = current;
  puVar2 = Array<unsigned_int>::operator[](&this->m_next,current);
  local_20 = *puVar2;
  while( true ) {
    if (local_20 == 0xffffffff) {
      return 0xffffffff;
    }
    puVar2 = Array<unsigned_int>::operator[](&this->m_keys,local_20);
    k1 = Array<unsigned_int>::operator[](&this->m_keys,uStack_1c);
    bVar1 = Equal<unsigned_int>::operator()(&local_21,puVar2,k1);
    if (bVar1) break;
    puVar2 = Array<unsigned_int>::operator[](&this->m_next,local_20);
    local_20 = *puVar2;
  }
  return local_20;
}

Assistant:

uint32_t getNext(uint32_t current) const
	{
		uint32_t i = m_next[current];
		E equal;
		while (i != UINT32_MAX) {
			if (equal(m_keys[i], m_keys[current]))
				return i;
			i = m_next[i];
		}
		return UINT32_MAX;
	}